

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtexthtmlparser.cpp
# Opt level: O1

void __thiscall
QTextHtmlParserNode::applyCssDeclarations
          (QTextHtmlParserNode *this,QList<QCss::Declaration> *declarations,
          QTextDocument *resourceProvider)

{
  QTextCharFormat *pQVar1;
  QTextBlockFormat *this_00;
  QPalette *pal;
  __atomic_base<int> _Var2;
  Declaration *pDVar3;
  DeclarationData *pDVar4;
  Value *pVVar5;
  QPalettePrivate *pQVar6;
  PrivateShared *pPVar7;
  Type *pTVar8;
  undefined1 auVar9 [16];
  bool bVar10;
  ushort uVar11;
  int iVar12;
  BorderStyle BVar13;
  uint uVar14;
  long lVar15;
  QArrayData *pQVar16;
  qint64 searchKey;
  int i;
  qsizetype qVar17;
  undefined4 uVar18;
  int propertyId;
  UnderlineStyle style;
  QPen *this_01;
  QTextFormat *pQVar19;
  ulong uVar20;
  long in_FS_OFFSET;
  QSharedDataPointer<QTextFormatPrivate> QVar21;
  qreal qVar22;
  QLatin1String QVar23;
  QLatin1String QVar24;
  QLatin1String QVar25;
  QLatin1String QVar26;
  QLatin1String QVar27;
  QLatin1String QVar28;
  QLatin1String QVar29;
  QColor QVar30;
  QTextLength QVar31;
  Attachment ignoredAttachment;
  Origin ignoredClip;
  Origin ignoredOrigin;
  Repeat ignoredRepeat;
  ValueExtractor extractor;
  Value cssValue;
  undefined1 *local_a8;
  undefined1 *puStack_a0;
  QPen pen;
  undefined1 *puStack_90;
  qreal indent;
  double *pdStack_70;
  undefined1 *local_68;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  int adjustment;
  undefined1 auStack_54 [12];
  bool ok;
  undefined7 uStack_47;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  extractor.pal.d = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
  extractor.pal._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor.f._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  extractor.f.d.d.ptr = (totally_ordered_wrapper<QFontPrivate_*>)&DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  extractor.declarations.d.ptr = (Declaration *)&DAT_aaaaaaaaaaaaaaaa;
  QPalette::QPalette((QPalette *)&cssValue);
  QCss::ValueExtractor::ValueExtractor(&extractor,declarations,(QPalette *)&cssValue);
  QPalette::~QPalette((QPalette *)&cssValue);
  QCss::ValueExtractor::extractBox(&extractor,this->margin,this->padding,(int *)0x0);
  if ((uint)(this->id + ~Html_tr) < 2) {
    cssValue.type = ~Unknown;
    cssValue._4_4_ = 0xffffffff;
    cssValue.variant.d.data._forAlignment = -NAN;
    cssValue.variant.d.data._8_8_ = 0xffffffffffffffff;
    cssValue.variant.d.data._16_8_ = 0xffffffffffffffff;
    pen.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0x0;
    puStack_90._0_4_ = 0;
    puStack_90._4_4_ = 0;
    indent = 2.12199579145934e-314;
    pdStack_70 = (double *)0x100000001;
    QCss::ValueExtractor::extractBorder
              (&extractor,(int *)&pen,(QBrush *)&this->field_0x170,(BorderStyle *)&indent,
               (QSize *)&cssValue);
    lVar15 = 0;
    do {
      uVar18 = 0xffffffff;
      if ((ulong)*(uint *)((long)&indent + lVar15) < 0xd) {
        uVar18 = *(undefined4 *)(&DAT_006bf838 + (ulong)*(uint *)((long)&indent + lVar15) * 4);
      }
      *(undefined4 *)((long)this->tableCellBorderStyle + lVar15) = uVar18;
      *(double *)((long)this->tableCellBorder + lVar15 * 2) =
           (double)*(int *)((long)&pen.d.d.ptr + lVar15);
      lVar15 = lVar15 + 4;
    } while (lVar15 != 0x10);
  }
  if ((declarations->d).size != 0) {
    pQVar1 = &this->charFormat;
    this_00 = &this->blockFormat;
    uVar20 = 0;
    do {
      pDVar3 = (declarations->d).ptr;
      pDVar4 = pDVar3[uVar20].d.d.ptr;
      if ((pDVar4->values).d.size == 0) goto switchD_0051bb1b_caseD_13;
      pVVar5 = (pDVar4->values).d.ptr;
      iVar12 = 0;
      if (pVVar5->type == KnownIdentifier) {
        iVar12 = ::QVariant::toInt((bool *)&pVVar5->variant);
      }
      pal = (QPalette *)(pDVar3 + uVar20);
      pQVar6 = pal->d;
      _Var2._M_i = pQVar6[1].ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
                   super___atomic_base<int>._M_i;
      pQVar19 = &this_00->super_QTextFormat;
      if (0x35 < _Var2._M_i) {
        propertyId = (int)pQVar1;
        switch(_Var2._M_i) {
        case 0x55:
        case 0x56:
          setListStyle(this,(QList<QCss::Value> *)&pQVar6[1].resolveMask);
          break;
        case 0x57:
        case 0x59:
        case 0x5a:
        case 0x5b:
        case 0x5c:
        case 0x5d:
        case 0x5e:
        case 0x5f:
        case 0x60:
        case 0x61:
        case 0x62:
        case 99:
        case 100:
        case 0x69:
        case 0x6b:
        case 0x6c:
        case 0x6d:
        case 0x6f:
        case 0x70:
          break;
        case 0x58:
          if (iVar12 == 0x17) {
            iVar12 = 0x84;
          }
          else if (iVar12 == 0x14) {
            iVar12 = 2;
          }
          else {
            if (iVar12 != 0x13) break;
            iVar12 = 1;
          }
          ::QVariant::QVariant((QVariant *)&cssValue,iVar12);
          iVar12 = 0x1010;
          goto LAB_0051cc53;
        case 0x65:
          ::QVariant::toString();
          pQVar16 = &((this->textListNumberPrefix).d.d)->super_QArrayData;
          pPVar7 = (PrivateShared *)(this->textListNumberPrefix).d.ptr;
          (this->textListNumberPrefix).d.d = (Data *)cssValue._0_8_;
          (this->textListNumberPrefix).d.ptr = (char16_t *)cssValue.variant.d.data.shared;
          qVar17 = (this->textListNumberPrefix).d.size;
          (this->textListNumberPrefix).d.size = cssValue.variant.d.data._8_8_;
          cssValue.variant.d.data.shared = pPVar7;
          goto LAB_0051c486;
        case 0x66:
          ::QVariant::toString();
          pQVar16 = &((this->textListNumberSuffix).d.d)->super_QArrayData;
          pPVar7 = (PrivateShared *)(this->textListNumberSuffix).d.ptr;
          (this->textListNumberSuffix).d.d = (Data *)cssValue._0_8_;
          (this->textListNumberSuffix).d.ptr = (char16_t *)cssValue.variant.d.data.shared;
          qVar17 = (this->textListNumberSuffix).d.size;
          (this->textListNumberSuffix).d.size = cssValue.variant.d.data._8_8_;
          cssValue.variant.d.data.shared = pPVar7;
LAB_0051c486:
          cssValue._0_8_ = pQVar16;
          cssValue.variant.d.data._8_8_ = qVar17;
          if (pQVar16 != (QArrayData *)0x0) {
            LOCK();
            (((QArrayData *)&pQVar16->ref_)->ref_)._q_value.super___atomic_base<int>._M_i =
                 (((QArrayData *)&pQVar16->ref_)->ref_)._q_value.super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QArrayData *)&pQVar16->ref_)->ref_)._q_value.super___atomic_base<int>._M_i == 0)
            {
LAB_0051cd51:
              QArrayData::deallocate(pQVar16,2,0x10);
            }
          }
          break;
        case 0x67:
          pen.d.d.ptr = (DataPtr)(totally_ordered_wrapper<QPenPrivate_*>)0xffffffffffffffff;
          bVar10 = QCss::Declaration::realValue((Declaration *)pal,(qreal *)&pen,"px");
          iVar12 = 3;
          if (!bVar10) {
            ok = true;
            cssValue.variant.d._24_8_ = &DAT_aaaaaaaaaaaaaaaa;
            cssValue.variant.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
            cssValue.variant.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
            cssValue.variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
            pTVar8 = *(Type **)&pal->d[1].detach_no;
            cssValue._4_4_ = 0xaaaaaaaa;
            cssValue.type = *pTVar8;
            ::QVariant::QVariant(&cssValue.variant,(QVariant *)(pTVar8 + 2));
            local_68 = &DAT_aaaaaaaaaaaaaaaa;
            indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
            pdStack_70 = (double *)&DAT_aaaaaaaaaaaaaaaa;
            QCss::Value::toString((QString *)&indent,&cssValue);
            QVar21.d.ptr = (totally_ordered_wrapper<QTextFormatPrivate_*>)
                           QString::toDouble((bool *)&indent);
            pen.d.d.ptr = (DataPtr)(DataPtr)QVar21.d.ptr;
            if (ok == true) {
              iVar12 = 1;
              if (((*(ushort *)&this->field_0x90 & 8) == 0) && (cssValue.type == Number)) {
                pen.d.d.ptr = (DataPtr)(DataPtr)((double)QVar21.d.ptr * 100.0);
                *(ushort *)&this->field_0x90 = *(ushort *)&this->field_0x90 | 0x10;
              }
            }
            else {
              auVar9._8_8_ = 0;
              auVar9._0_8_ = puStack_90;
              _pen = (QTextFormat)(auVar9 << 0x40);
              iVar12 = 0;
            }
            if (indent != 0.0) {
              LOCK();
              *(int *)indent = *(int *)indent + -1;
              UNLOCK();
              if (*(int *)indent == 0) {
                QArrayData::deallocate((QArrayData *)indent,2,0x10);
              }
            }
            ::QVariant::~QVariant(&cssValue.variant);
          }
          if ((this->field_0x90 & 8) != 0) {
            iVar12 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x1049);
          }
          ::QVariant::QVariant((QVariant *)&cssValue,(double)pen.d.d.ptr);
          QTextFormat::setProperty(&this_00->super_QTextFormat,0x1048,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          ::QVariant::QVariant((QVariant *)&cssValue,iVar12);
          QTextFormat::setProperty(&this_00->super_QTextFormat,0x1049,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          break;
        case 0x68:
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          pdStack_70 = (double *)&DAT_aaaaaaaaaaaaaaaa;
          ::QVariant::toString();
          QVar26.m_data = (char *)0xc;
          QVar26.m_size = (qsizetype)&indent;
          iVar12 = QString::compare(QVar26,0x6bf87d);
          if (iVar12 == 0) {
            iVar12 = 1;
          }
          else {
            QVar27.m_data = &DAT_00000005;
            QVar27.m_size = (qsizetype)&indent;
            iVar12 = QString::compare(QVar27,0x6b7015);
            if (iVar12 == 0) {
              iVar12 = 2;
            }
            else {
              QVar28.m_data = (char *)0x7;
              QVar28.m_size = (qsizetype)&indent;
              iVar12 = QString::compare(QVar28,0x6bf88a);
              if (iVar12 == 0) {
                iVar12 = 3;
              }
              else {
                QVar29.m_data = (char *)0xd;
                QVar29.m_size = (qsizetype)&indent;
                iVar12 = QString::compare(QVar29,0x6bf892);
                iVar12 = (uint)(iVar12 == 0) << 2;
              }
            }
          }
          if ((this->field_0x90 & 0x10) != 0) {
            qVar22 = QTextFormat::doubleProperty(&this_00->super_QTextFormat,0x1048);
            ::QVariant::QVariant((QVariant *)&cssValue,qVar22 / 100.0);
            QTextFormat::setProperty(&this_00->super_QTextFormat,0x1048,(QVariant *)&cssValue);
            ::QVariant::~QVariant((QVariant *)&cssValue);
          }
          ::QVariant::QVariant((QVariant *)&cssValue,iVar12);
          QTextFormat::setProperty(&this_00->super_QTextFormat,0x1049,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          this->field_0x90 = this->field_0x90 | 8;
          if (indent == 0.0) break;
          LOCK();
          *(int *)indent = *(int *)indent + -1;
          UNLOCK();
          pQVar16 = (QArrayData *)indent;
          if (*(int *)indent != 0) break;
          goto LAB_0051cd51;
        case 0x6a:
          if ((resourceProvider != (QTextDocument *)0x0) &&
             (*(long *)&resourceProvider->field_0x8 != 0)) {
            cssValue.type._0_1_ = 0xaa;
            searchKey = ::QVariant::toLongLong((bool *)(*(long *)&pQVar6[1].detach_no + 8));
            bVar10 = (undefined1)cssValue.type == Number;
            if (bVar10) {
              applyForegroundImage(this,searchKey,resourceProvider);
            }
          }
          break;
        case 0x6e:
          QPalette::QPalette((QPalette *)&pen);
          QVar30 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&pen);
          indent = QVar30._0_8_;
          pdStack_70._0_6_ = QVar30.ct._4_6_;
          QColor::operator_cast_to_QVariant((QVariant *)&cssValue,(QColor *)&indent);
          QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x2020,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
LAB_0051ca34:
          QPalette::~QPalette((QPalette *)&pen);
          break;
        case 0x71:
          indent = -NAN;
          bVar10 = QCss::Declaration::realValue((Declaration *)pal,&indent,"px");
          if (bVar10) {
            pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::penProperty((QTextFormat *)&pen,propertyId);
            QPen::setWidthF(&pen,indent);
            goto LAB_0051c89e;
          }
          break;
        case 0x72:
          pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::penProperty((QTextFormat *)&pen,propertyId);
          QPen::setStyle(&pen,SolidLine);
          QPalette::QPalette((QPalette *)&indent);
          QVar30 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&indent);
          cssValue._0_8_ = QVar30._0_8_;
          cssValue.variant.d.data._0_6_ = QVar30.ct._4_6_;
          QPen::setColor(&pen,(QColor *)&cssValue);
          QPalette::~QPalette((QPalette *)&indent);
LAB_0051c89e:
          this_01 = &pen;
          QPen::operator_cast_to_QVariant((QVariant *)&cssValue,this_01);
          QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x2022,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          goto LAB_0051c8cb;
        case 0x73:
          indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::penProperty((QTextFormat *)&indent,propertyId);
          if (iVar12 - 0x34U < 3) {
            QPen::setCapStyle((QPen *)&indent,
                              *(PenCapStyle *)(&DAT_006bf86c + (ulong)(iVar12 - 0x34U) * 4));
          }
          goto LAB_0051c7f6;
        case 0x74:
          indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QTextFormat::penProperty((QTextFormat *)&indent,propertyId);
          if (iVar12 - 0x37U < 4) {
            QPen::setJoinStyle((QPen *)&indent,
                               *(PenJoinStyle *)(&DAT_006be320 + (ulong)(iVar12 - 0x37U) * 4));
          }
LAB_0051c7f6:
          this_01 = (QPen *)&indent;
          QPen::operator_cast_to_QVariant((QVariant *)&cssValue,this_01);
          QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x2022,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
LAB_0051c8cb:
          QPen::~QPen(this_01);
          break;
        case 0x75:
          indent = -NAN;
          bVar10 = QCss::Declaration::realValue((Declaration *)pal,&indent,(char *)0x0);
          if (bVar10) {
            pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::penProperty((QTextFormat *)&pen,propertyId);
            QPen::setMiterLimit(&pen,indent);
            goto LAB_0051c89e;
          }
          break;
        case 0x76:
          local_68 = &DAT_aaaaaaaaaaaaaaaa;
          indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          pdStack_70 = (double *)&DAT_aaaaaaaaaaaaaaaa;
          QCss::Declaration::dashArray((QList<double> *)&indent,(Declaration *)pal);
          if (local_68 != (undefined1 *)0x0) {
            pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::penProperty((QTextFormat *)&pen,propertyId);
            QPen::setDashPattern(&pen,(QList<double> *)&indent);
            QPen::operator_cast_to_QVariant((QVariant *)&cssValue,&pen);
            QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x2022,(QVariant *)&cssValue);
            ::QVariant::~QVariant((QVariant *)&cssValue);
            QPen::~QPen(&pen);
          }
          if (indent != 0.0) {
            LOCK();
            *(int *)indent = *(int *)indent + -1;
            UNLOCK();
            if (*(int *)indent == 0) {
              QArrayData::deallocate((QArrayData *)indent,8,0x10);
            }
          }
          break;
        case 0x77:
          indent = -NAN;
          bVar10 = QCss::Declaration::realValue((Declaration *)pal,&indent,(char *)0x0);
          if (bVar10) {
            pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::penProperty((QTextFormat *)&pen,propertyId);
            QPen::setDashOffset(&pen,indent);
            goto LAB_0051c89e;
          }
          break;
        case 0x78:
          indent = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QPalette::QPalette((QPalette *)&cssValue);
          QCss::Declaration::brushValue((Declaration *)&indent,pal);
          QPalette::~QPalette((QPalette *)&cssValue);
          QBrush::operator_cast_to_QVariant((QVariant *)&cssValue,(QBrush *)&indent);
          QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x821,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          QBrush::~QBrush((QBrush *)&indent);
          break;
        default:
          if (_Var2._M_i == 0x36) {
            cssValue._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
            cssValue.variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
            QCss::ValueExtractor::lengthValues(&extractor,(Declaration *)pal,(int *)&cssValue);
            this->tableBorder = (double)(int)cssValue.type;
          }
          else if ((_Var2._M_i == 0x49) && (this->id == Html_img)) {
            puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
            pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
            QTextFormat::toImageFormat((QTextFormat *)&pen);
            QVar31 = QCss::ValueExtractor::textLength(&extractor,(Declaration *)pal);
            pdStack_70 = (double *)QVar31.fixedValueOrPercentage;
            indent = (qreal)CONCAT44(indent._4_4_,QVar31.lengthType);
            QTextLength::operator_cast_to_QVariant((QVariant *)&cssValue,(QTextLength *)&indent);
            QTextFormat::setProperty((QTextFormat *)&pen,0x5015,(QVariant *)&cssValue);
            ::QVariant::~QVariant((QVariant *)&cssValue);
            QTextFormat::operator=(&pQVar1->super_QTextFormat,(QTextFormat *)&pen);
            QTextFormat::~QTextFormat((QTextFormat *)&pen);
          }
        }
        goto switchD_0051bb1b_caseD_13;
      }
      switch(_Var2._M_i) {
      case 0xe:
        iVar12 = ::QVariant::toInt((bool *)(*(long *)&pQVar6[1].detach_no + 8));
        ::QVariant::QVariant((QVariant *)&cssValue,iVar12);
        iVar12 = 0x1040;
        goto LAB_0051cc53;
      case 0xf:
        bVar10 = QCss::Declaration::intValue((Declaration *)pal,&this->cssListIndent,(char *)0x0);
        if (bVar10) {
          this->field_0x90 = this->field_0x90 | 0x20;
        }
        break;
      case 0x10:
        ::QVariant::toString();
        QVar23.m_data = &DAT_00000005;
        QVar23.m_size = (qsizetype)&cssValue;
        iVar12 = QString::compare(QVar23,0x6d7aae);
        if (cssValue._0_8_ != 0) {
          LOCK();
          *(int *)cssValue._0_8_ = *(int *)cssValue._0_8_ + -1;
          UNLOCK();
          if (*(int *)cssValue._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)cssValue._0_8_,2,0x10);
          }
        }
        if (iVar12 == 0) {
          this->field_0x90 = this->field_0x90 | 0x40;
        }
        break;
      case 0x11:
        ::QVariant::toString();
        QVar24.m_data = &DAT_00000005;
        QVar24.m_size = (qsizetype)&cssValue;
        iVar12 = QString::compare(QVar24,0x6bc9e0);
        if (cssValue._0_8_ != 0) {
          LOCK();
          *(int *)cssValue._0_8_ = *(int *)cssValue._0_8_ + -1;
          UNLOCK();
          if (*(int *)cssValue._0_8_ == 0) {
            QArrayData::deallocate((QArrayData *)cssValue._0_8_,2,0x10);
          }
        }
        if (iVar12 == 0) {
          this->field_0x90 = this->field_0x90 | 0x80;
        }
        else {
          ::QVariant::toString();
          QVar25.m_data = (char *)0x4;
          QVar25.m_size = (qsizetype)&cssValue;
          iVar12 = QString::compare(QVar25,0x6bf8a0);
          if (cssValue._0_8_ != 0) {
            LOCK();
            *(int *)cssValue._0_8_ = *(int *)cssValue._0_8_ + -1;
            UNLOCK();
            if (*(int *)cssValue._0_8_ == 0) {
              QArrayData::deallocate((QArrayData *)cssValue._0_8_,2,0x10);
            }
          }
          if (iVar12 == 0) {
            *(ushort *)&this->field_0x90 = *(ushort *)&this->field_0x90 | 0x180;
          }
        }
        break;
      case 0x12:
        iVar12 = ::QVariant::toInt((bool *)(*(long *)&pQVar6[1].detach_no + 8));
        this->userState = iVar12;
        break;
      case 0x13:
      case 0x18:
      case 0x19:
      case 0x1b:
      case 0x1c:
      case 0x1d:
      case 0x1e:
      case 0x20:
      case 0x21:
      case 0x22:
      case 0x23:
      case 0x24:
      case 0x27:
      case 0x28:
      case 0x29:
      case 0x2a:
      case 0x2b:
      case 0x2d:
      case 0x2e:
      case 0x2f:
      case 0x30:
        break;
      case 0x14:
        indent = 0.0;
        bVar10 = QCss::Declaration::realValue((Declaration *)pal,&indent,"px");
        if (bVar10) {
          ::QVariant::QVariant((QVariant *)&cssValue,indent);
          iVar12 = 0x1034;
          goto LAB_0051cc53;
        }
        break;
      case 0x15:
        switch(iVar12) {
        case 0x19:
          style = SingleUnderline;
          break;
        case 0x1a:
          style = DotLine;
          break;
        case 0x1b:
          style = DashUnderline;
          break;
        case 0x1c:
          style = DashDotLine;
          break;
        case 0x1d:
          style = DashDotDotLine;
          break;
        default:
          goto switchD_0051bb1b_caseD_13;
        case 0x23:
          style = WaveUnderline;
          break;
        case 0x27:
          style = NoUnderline;
        }
        QTextCharFormat::setUnderlineStyle(pQVar1,style);
        break;
      case 0x16:
        switch(iVar12) {
        case 0x11:
          iVar12 = 2;
          break;
        case 0x12:
          iVar12 = 1;
          break;
        case 0x13:
        case 0x14:
switchD_0051bccc_caseD_13:
          iVar12 = 0;
          break;
        case 0x15:
          iVar12 = 4;
          break;
        case 0x16:
          iVar12 = 5;
          break;
        default:
          if (iVar12 != 0x24) goto switchD_0051bccc_caseD_13;
          iVar12 = 3;
        }
        ::QVariant::QVariant((QVariant *)&cssValue,iVar12);
        iVar12 = 0x2021;
        pQVar19 = &pQVar1->super_QTextFormat;
LAB_0051cc53:
        QTextFormat::setProperty(pQVar19,iVar12,(QVariant *)&cssValue);
LAB_0051cc5e:
        ::QVariant::~QVariant((QVariant *)&cssValue);
        break;
      case 0x17:
        switch(iVar12) {
        case 1:
          this->wsm = WhiteSpaceNormal;
          break;
        case 2:
          this->wsm = WhiteSpacePre;
          break;
        case 3:
          this->wsm = WhiteSpaceNoWrap;
          break;
        case 4:
          this->wsm = WhiteSpacePreLine;
          break;
        case 5:
          this->wsm = WhiteSpacePreWrap;
        }
        break;
      case 0x1a:
        local_68 = (undefined1 *)0xffffffffffffffff;
        uStack_60 = 0xffffffff;
        uStack_5c = 0xffffffff;
        indent = -NAN;
        pdStack_70 = (double *)0xffffffffffffffff;
        puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
        pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
        lVar15 = 0;
        do {
          QBrush::QBrush((QBrush *)((long)&pen.d.d.ptr + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        local_a8 = &DAT_aaaaaaaaaaaaaaaa;
        puStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
        cssValue.type = ~Unknown;
        cssValue._4_4_ = 0xffffffff;
        cssValue.variant.d.data._forAlignment = -NAN;
        cssValue.variant.d.data._8_8_ = 0xffffffffffffffff;
        cssValue.variant.d.data._16_8_ = 0xffffffffffffffff;
        _adjustment = (undefined1  [16])0x0;
        _ok = (QBrushData *)0x100000001;
        uStack_40 = 0x100000001;
        bVar10 = QCss::ValueExtractor::extractBorder
                           (&extractor,&adjustment,(QBrush *)&pen,(BorderStyle *)&ok,
                            (QSize *)&cssValue);
        lVar15 = 0;
        do {
          uVar18 = 0xffffffff;
          if ((ulong)*(uint *)(&ok + lVar15 * 4) < 0xd) {
            uVar18 = *(undefined4 *)(&DAT_006bf838 + (ulong)*(uint *)(&ok + lVar15 * 4) * 4);
          }
          iVar12 = (&adjustment)[lVar15];
          *(undefined4 *)((long)&local_a8 + lVar15 * 4) = uVar18;
          (&indent)[lVar15] = (double)iVar12;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 4);
        if (bVar10) {
          this->tableBorder = indent;
          if (*(int *)((long)pen.d.d.ptr + 8) != 0) {
            QBrush::operator=(&this->borderBrush,(QBrush *)&pen);
          }
          if ((QFlagsStorage<Qt::AlignmentFlag>)local_a8._0_4_ !=
              (QFlagsStorage<Qt::AlignmentFlag>)0xffffffff) {
            this->borderStyle = local_a8._0_4_;
          }
        }
        lVar15 = 0x18;
        do {
          QBrush::~QBrush((QBrush *)((long)&pen.d.d.ptr + lVar15));
          lVar15 = lVar15 + -8;
        } while (lVar15 != -8);
        break;
      case 0x1f:
        bVar10 = QCss::Declaration::borderCollapseValue((Declaration *)pal);
        this->borderCollapse = bVar10;
        break;
      case 0x25:
        if (iVar12 == 0x25) {
          uVar14 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x7000);
          uVar14 = uVar14 & 0xfffffffe;
        }
        else {
          if (iVar12 != 0x26) break;
          uVar14 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x7000);
          uVar14 = uVar14 | 1;
        }
        goto LAB_0051cac0;
      case 0x26:
        if (iVar12 == 0x25) {
          uVar14 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x7000);
          uVar14 = uVar14 & 0xffffffef;
        }
        else {
          if (iVar12 != 0x26) break;
          uVar14 = QTextFormat::intProperty(&this_00->super_QTextFormat,0x7000);
          uVar14 = uVar14 | 0x10;
        }
LAB_0051cac0:
        ::QVariant::QVariant((QVariant *)&cssValue,uVar14);
        QTextFormat::setProperty(&this_00->super_QTextFormat,0x7000,(QVariant *)&cssValue);
        goto LAB_0051cc5e;
      case 0x2c:
        BVar13 = QCss::Declaration::styleValue((Declaration *)pal);
        if ((BVar13 != BorderStyle_Unknown) &&
           (BVar13 = QCss::Declaration::styleValue((Declaration *)pal), BVar13 != BorderStyle_Native
           )) {
          BVar13 = QCss::Declaration::styleValue((Declaration *)pal);
          this->borderStyle = BVar13 - BorderStyle_Dotted;
        }
        break;
      case 0x31:
        cssValue.variant.d.data._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
        cssValue.variant.d.data._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
        cssValue._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
        cssValue.variant.d.data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
        lVar15 = 0;
        do {
          QBrush::QBrush((QBrush *)((long)&cssValue.type + lVar15));
          lVar15 = lVar15 + 8;
        } while (lVar15 != 0x20);
        QPalette::QPalette((QPalette *)&indent);
        QCss::Declaration::brushValues((Declaration *)pal,(QBrush *)&cssValue,(QPalette *)&indent);
        QPalette::~QPalette((QPalette *)&indent);
        if (*(int *)(cssValue._0_8_ + 8) != 0) {
          QBrush::operator=(&this->borderBrush,(QBrush *)&cssValue);
        }
        lVar15 = 0x18;
        do {
          QBrush::~QBrush((QBrush *)((long)&cssValue.type + lVar15));
          lVar15 = lVar15 + -8;
        } while (lVar15 != -8);
        break;
      default:
        if (_Var2._M_i == 2) {
          QPalette::QPalette((QPalette *)&pen);
          QVar30 = QCss::Declaration::colorValue((Declaration *)pal,(QPalette *)&pen);
          indent = QVar30._0_8_;
          pdStack_70._0_6_ = QVar30.ct._4_6_;
          QBrush::QBrush((QBrush *)&ok,(QColor *)&indent,SolidPattern);
          QBrush::operator_cast_to_QVariant((QVariant *)&cssValue,(QBrush *)&ok);
          QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x821,(QVariant *)&cssValue);
          ::QVariant::~QVariant((QVariant *)&cssValue);
          QBrush::~QBrush((QBrush *)&ok);
          goto LAB_0051ca34;
        }
        if (_Var2._M_i == 3) {
          uVar11 = *(ushort *)&this->field_0x90 & 0xfffc;
          *(ushort *)&this->field_0x90 = uVar11;
          if (iVar12 == 0x14) {
            uVar11 = uVar11 | 2;
          }
          else {
            if (iVar12 != 0x13) break;
            uVar11 = uVar11 | 1;
          }
          *(ushort *)&this->field_0x90 = uVar11;
        }
      }
switchD_0051bb1b_caseD_13:
      uVar20 = uVar20 + 1;
    } while (uVar20 < (ulong)(declarations->d).size);
  }
  puStack_90 = &DAT_aaaaaaaaaaaaaaaa;
  pen.d.d.ptr = (DataPtr)(DataPtr)&DAT_aaaaaaaaaaaaaaaa;
  QFont::QFont((QFont *)&pen);
  adjustment = 0xffffff01;
  QCss::ValueExtractor::extractFont(&extractor,(QFont *)&pen,&adjustment);
  iVar12 = QFont::pixelSize((QFont *)&pen);
  if (0x3fffffff < iVar12) {
    QFont::setPixelSize((QFont *)&pen,0x3fffffff);
  }
  pQVar1 = &this->charFormat;
  QTextCharFormat::setFont(pQVar1,(QFont *)&pen,FontPropertiesSpecifiedOnly);
  if (-2 < adjustment) {
    ::QVariant::QVariant((QVariant *)&cssValue,adjustment);
    QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x2002,(QVariant *)&cssValue);
    ::QVariant::~QVariant((QVariant *)&cssValue);
  }
  local_a8 = (undefined1 *)((ulong)local_a8 & 0xffffffff00000000);
  ignoredRepeat = 0xaaaaaaaa;
  indent = 0.0;
  pdStack_70 = (double *)0x0;
  local_68 = (undefined1 *)0x0;
  _ok = (QBrushData *)&DAT_aaaaaaaaaaaaaaaa;
  QBrush::QBrush((QBrush *)&ok);
  ignoredOrigin = 0xaaaaaaaa;
  ignoredClip = 0xaaaaaaaa;
  ignoredAttachment = 0xaaaaaaaa;
  QCss::ValueExtractor::extractBackground
            (&extractor,(QBrush *)&ok,(QString *)&indent,&ignoredRepeat,(Alignment *)&local_a8,
             &ignoredOrigin,&ignoredAttachment,&ignoredClip);
  if ((resourceProvider == (QTextDocument *)0x0) || (local_68 == (undefined1 *)0x0)) {
    if (_ok->style != NoBrush) {
      QBrush::operator_cast_to_QVariant((QVariant *)&cssValue,(QBrush *)&ok);
      QTextFormat::setProperty(&pQVar1->super_QTextFormat,0x820,(QVariant *)&cssValue);
      ::QVariant::~QVariant((QVariant *)&cssValue);
      if (this->id == Html_hr) {
        QBrush::operator_cast_to_QVariant((QVariant *)&cssValue,(QBrush *)&ok);
        QTextFormat::setProperty(&(this->blockFormat).super_QTextFormat,0x820,(QVariant *)&cssValue)
        ;
        ::QVariant::~QVariant((QVariant *)&cssValue);
      }
    }
  }
  else {
    applyBackgroundImage(this,(QString *)&indent,resourceProvider);
  }
  QBrush::~QBrush((QBrush *)&ok);
  if (indent != 0.0) {
    LOCK();
    *(int *)indent = *(int *)indent + -1;
    UNLOCK();
    if (*(int *)indent == 0) {
      QArrayData::deallocate((QArrayData *)indent,2,0x10);
    }
  }
  QFont::~QFont((QFont *)&pen);
  QPalette::~QPalette(&extractor.pal);
  QFont::~QFont(&extractor.f);
  QArrayDataPointer<QCss::Declaration>::~QArrayDataPointer
            ((QArrayDataPointer<QCss::Declaration> *)&extractor);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QTextHtmlParserNode::applyCssDeclarations(const QList<QCss::Declaration> &declarations, const QTextDocument *resourceProvider)
{
    QCss::ValueExtractor extractor(declarations);
    extractor.extractBox(margin, padding);

    auto getBorderValues = [&extractor](qreal *borderWidth, QBrush *borderBrush, QTextFrameFormat::BorderStyle *borderStyles) {
        QCss::BorderStyle cssStyles[4];
        int cssBorder[4];
        QSize cssRadii[4]; // unused
        for (int i = 0; i < 4; ++i) {
            cssStyles[i] = QCss::BorderStyle_None;
            cssBorder[i] = 0;
        }
        // this will parse (and cache) "border-width" as a list so the
        // QCss::BorderWidth parsing below which expects a single value
        // will not work as expected - which in this case does not matter
        // because tableBorder is not relevant for cells.
        bool hit = extractor.extractBorder(cssBorder, borderBrush, cssStyles, cssRadii);
        for (int i = 0; i < 4; ++i) {
            borderStyles[i] = toQTextFrameFormat(cssStyles[i]);
            borderWidth[i] = static_cast<qreal>(cssBorder[i]);
        }
        return hit;
    };

    if (id == Html_td || id == Html_th)
        getBorderValues(tableCellBorder, tableCellBorderBrush, tableCellBorderStyle);

    for (int i = 0; i < declarations.size(); ++i) {
        const QCss::Declaration &decl = declarations.at(i);
        if (decl.d->values.isEmpty()) continue;

        QCss::KnownValue identifier = QCss::UnknownValue;
        if (decl.d->values.constFirst().type == QCss::Value::KnownIdentifier)
            identifier = static_cast<QCss::KnownValue>(decl.d->values.constFirst().variant.toInt());

        switch (decl.d->propertyId) {
        case QCss::BorderColor: {
            QBrush bordersBrush[4];
            decl.brushValues(bordersBrush);
            if (bordersBrush[0].color().isValid())
                borderBrush = bordersBrush[0];
            break;
        }
        case QCss::BorderStyles:
            if (decl.styleValue() != QCss::BorderStyle_Unknown && decl.styleValue() != QCss::BorderStyle_Native)
                borderStyle = static_cast<QTextFrameFormat::BorderStyle>(decl.styleValue() - 1);
            break;
        case QCss::BorderWidth: {
            int borders[4];
            extractor.lengthValues(decl, borders);
            tableBorder = borders[0];
            }
            break;
        case QCss::Border: {
            qreal tblBorder[4];
            QBrush tblBorderBrush[4];
            QTextFrameFormat::BorderStyle tblBorderStyle[4];
            if (getBorderValues(tblBorder, tblBorderBrush, tblBorderStyle)) {
                tableBorder = tblBorder[0];
                if (tblBorderBrush[0].color().isValid())
                    borderBrush = tblBorderBrush[0];
                if (tblBorderStyle[0] != static_cast<QTextFrameFormat::BorderStyle>(-1))
                    borderStyle = tblBorderStyle[0];
            }
        }
        break;
        case QCss::BorderCollapse:
            borderCollapse = decl.borderCollapseValue();
            break;
        case QCss::Color: charFormat.setForeground(decl.colorValue()); break;
        case QCss::Float:
            cssFloat = QTextFrameFormat::InFlow;
            switch (identifier) {
            case QCss::Value_Left: cssFloat = QTextFrameFormat::FloatLeft; break;
            case QCss::Value_Right: cssFloat = QTextFrameFormat::FloatRight; break;
            default: break;
            }
            break;
        case QCss::QtBlockIndent:
            blockFormat.setIndent(decl.d->values.constFirst().variant.toInt());
            break;
        case QCss::QtLineHeightType: {
            QString lineHeightTypeName = decl.d->values.constFirst().variant.toString();
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (lineHeightTypeName.compare("proportional"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::ProportionalHeight;
            else if (lineHeightTypeName.compare("fixed"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::FixedHeight;
            else if (lineHeightTypeName.compare("minimum"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::MinimumHeight;
            else if (lineHeightTypeName.compare("line-distance"_L1, Qt::CaseInsensitive) == 0)
                lineHeightType = QTextBlockFormat::LineDistanceHeight;
            else
                lineHeightType = QTextBlockFormat::SingleHeight;

            if (hasLineHeightMultiplier) {
                qreal lineHeight = blockFormat.lineHeight() / 100.0;
                blockFormat.setProperty(QTextBlockFormat::LineHeight, lineHeight);
            }

            blockFormat.setProperty(QTextBlockFormat::LineHeightType, lineHeightType);
            hasOwnLineHeightType = true;
        }
        break;
        case QCss::LineHeight: {
            qreal lineHeight;
            QTextBlockFormat::LineHeightTypes lineHeightType;
            if (decl.realValue(&lineHeight, "px")) {
                lineHeightType = QTextBlockFormat::MinimumHeight;
            } else {
                bool ok;
                QCss::Value cssValue = decl.d->values.constFirst();
                QString value = cssValue.toString();
                lineHeight = value.toDouble(&ok);
                if (ok) {
                    if (!hasOwnLineHeightType && cssValue.type == QCss::Value::Number) {
                        lineHeight *= 100.0;
                        hasLineHeightMultiplier = true;
                    }
                    lineHeightType = QTextBlockFormat::ProportionalHeight;
                } else {
                    lineHeight = 0.0;
                    lineHeightType = QTextBlockFormat::SingleHeight;
                }
            }

            // Only override line height type if specified in same node
            if (hasOwnLineHeightType)
                lineHeightType = QTextBlockFormat::LineHeightTypes(blockFormat.lineHeightType());

            blockFormat.setLineHeight(lineHeight, lineHeightType);
            break;
        }
        case QCss::TextIndent: {
            qreal indent = 0;
            if (decl.realValue(&indent, "px"))
                blockFormat.setTextIndent(indent);
            break; }
        case QCss::QtListIndent:
            if (decl.intValue(&cssListIndent))
                hasCssListIndent = true;
            break;
        case QCss::QtParagraphType:
            if (decl.d->values.constFirst().variant.toString().compare("empty"_L1, Qt::CaseInsensitive) == 0)
                isEmptyParagraph = true;
            break;
        case QCss::QtTableType:
            if (decl.d->values.constFirst().variant.toString().compare("frame"_L1, Qt::CaseInsensitive) == 0)
                isTextFrame = true;
            else if (decl.d->values.constFirst().variant.toString().compare("root"_L1, Qt::CaseInsensitive) == 0) {
                isTextFrame = true;
                isRootFrame = true;
            }
            break;
        case QCss::QtUserState:
            userState = decl.d->values.constFirst().variant.toInt();
            break;
        case QCss::Whitespace:
            switch (identifier) {
            case QCss::Value_Normal: wsm = QTextHtmlParserNode::WhiteSpaceNormal; break;
            case QCss::Value_Pre: wsm = QTextHtmlParserNode::WhiteSpacePre; break;
            case QCss::Value_NoWrap: wsm = QTextHtmlParserNode::WhiteSpaceNoWrap; break;
            case QCss::Value_PreWrap: wsm = QTextHtmlParserNode::WhiteSpacePreWrap; break;
            case QCss::Value_PreLine: wsm = QTextHtmlParserNode::WhiteSpacePreLine; break;
            default: break;
            }
            break;
        case QCss::VerticalAlignment:
            switch (identifier) {
            case QCss::Value_Sub: charFormat.setVerticalAlignment(QTextCharFormat::AlignSubScript); break;
            case QCss::Value_Super: charFormat.setVerticalAlignment(QTextCharFormat::AlignSuperScript); break;
            case QCss::Value_Middle: charFormat.setVerticalAlignment(QTextCharFormat::AlignMiddle); break;
            case QCss::Value_Top: charFormat.setVerticalAlignment(QTextCharFormat::AlignTop); break;
            case QCss::Value_Bottom: charFormat.setVerticalAlignment(QTextCharFormat::AlignBottom); break;
            default: charFormat.setVerticalAlignment(QTextCharFormat::AlignNormal); break;
            }
            break;
        case QCss::PageBreakBefore:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysBefore); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysBefore); break;
            default: break;
            }
            break;
        case QCss::PageBreakAfter:
            switch (identifier) {
            case QCss::Value_Always: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() | QTextFormat::PageBreak_AlwaysAfter); break;
            case QCss::Value_Auto: blockFormat.setPageBreakPolicy(blockFormat.pageBreakPolicy() & ~QTextFormat::PageBreak_AlwaysAfter); break;
            default: break;
            }
            break;
        case QCss::TextUnderlineStyle:
            switch (identifier) {
            case QCss::Value_None: charFormat.setUnderlineStyle(QTextCharFormat::NoUnderline); break;
            case QCss::Value_Solid: charFormat.setUnderlineStyle(QTextCharFormat::SingleUnderline); break;
            case QCss::Value_Dashed: charFormat.setUnderlineStyle(QTextCharFormat::DashUnderline); break;
            case QCss::Value_Dotted: charFormat.setUnderlineStyle(QTextCharFormat::DotLine); break;
            case QCss::Value_DotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotLine); break;
            case QCss::Value_DotDotDash: charFormat.setUnderlineStyle(QTextCharFormat::DashDotDotLine); break;
            case QCss::Value_Wave: charFormat.setUnderlineStyle(QTextCharFormat::WaveUnderline); break;
            default: break;
            }
            break;
        case QCss::TextDecorationColor: charFormat.setUnderlineColor(decl.colorValue()); break;
        case QCss::ListStyleType:
        case QCss::ListStyle:
            setListStyle(decl.d->values);
            break;
        case QCss::QtListNumberPrefix:
            textListNumberPrefix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::QtListNumberSuffix:
            textListNumberSuffix = decl.d->values.constFirst().variant.toString();
            break;
        case QCss::TextAlignment:
            switch (identifier) {
            case QCss::Value_Left: blockFormat.setAlignment(Qt::AlignLeft); break;
            case QCss::Value_Center: blockFormat.setAlignment(Qt::AlignCenter); break;
            case QCss::Value_Right: blockFormat.setAlignment(Qt::AlignRight); break;
            default: break;
            }
            break;

        case QCss::QtForegroundTextureCacheKey:
        {
            if (resourceProvider != nullptr && QTextDocumentPrivate::get(resourceProvider) != nullptr) {
                bool ok;
                qint64 searchKey = decl.d->values.constFirst().variant.toLongLong(&ok);
                if (ok)
                    applyForegroundImage(searchKey, resourceProvider);
            }
            break;
        }
        case QCss::QtStrokeColor:
        {
            QPen pen = charFormat.textOutline();
            pen.setStyle(Qt::SolidLine);
            pen.setColor(decl.colorValue());
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeWidth:
        {
            qreal width;
            if (decl.realValue(&width, "px")) {
                QPen pen = charFormat.textOutline();
                pen.setWidthF(width);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeLineCap:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_SquareCap: pen.setCapStyle(Qt::SquareCap); break;
            case QCss::Value_FlatCap: pen.setCapStyle(Qt::FlatCap); break;
            case QCss::Value_RoundCap: pen.setCapStyle(Qt::RoundCap); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeLineJoin:
        {
            QPen pen = charFormat.textOutline();
            switch (identifier) {
            case QCss::Value_MiterJoin: pen.setJoinStyle(Qt::MiterJoin); break;
            case QCss::Value_BevelJoin: pen.setJoinStyle(Qt::BevelJoin); break;
            case QCss::Value_RoundJoin: pen.setJoinStyle(Qt::RoundJoin); break;
            case QCss::Value_SvgMiterJoin: pen.setJoinStyle(Qt::SvgMiterJoin); break;
            default: break;
            }
            charFormat.setTextOutline(pen);
            break;
        }
        case QCss::QtStrokeMiterLimit:
        {
            qreal miterLimit;
            if (decl.realValue(&miterLimit)) {
                QPen pen = charFormat.textOutline();
                pen.setMiterLimit(miterLimit);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashArray:
        {
            QList<qreal> dashes = decl.dashArray();
            if (!dashes.empty()) {
                QPen pen = charFormat.textOutline();
                pen.setDashPattern(dashes);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtStrokeDashOffset:
        {
            qreal dashOffset;
            if (decl.realValue(&dashOffset)) {
                QPen pen = charFormat.textOutline();
                pen.setDashOffset(dashOffset);
                charFormat.setTextOutline(pen);
            }
            break;
        }
        case QCss::QtForeground:
        {
            QBrush brush = decl.brushValue();
            charFormat.setForeground(brush);
            break;
        }
        case QCss::MaximumWidth:
            if (id == Html_img) {
                auto imageFormat = charFormat.toImageFormat();
                imageFormat.setMaximumWidth(extractor.textLength(decl));
                charFormat = imageFormat;
            }
            break;
        default: break;
        }
    }

    QFont f;
    int adjustment = -255;
    extractor.extractFont(&f, &adjustment);
    if (f.pixelSize() > INT32_MAX / 2)
        f.setPixelSize(INT32_MAX / 2);   // avoid even more extreme values
    charFormat.setFont(f, QTextCharFormat::FontPropertiesSpecifiedOnly);

    if (adjustment >= -1)
        charFormat.setProperty(QTextFormat::FontSizeAdjustment, adjustment);

    {
        Qt::Alignment ignoredAlignment;
        QCss::Repeat ignoredRepeat;
        QString bgImage;
        QBrush bgBrush;
        QCss::Origin ignoredOrigin, ignoredClip;
        QCss::Attachment ignoredAttachment;
        extractor.extractBackground(&bgBrush, &bgImage, &ignoredRepeat, &ignoredAlignment,
                                    &ignoredOrigin, &ignoredAttachment, &ignoredClip);

        if (!bgImage.isEmpty() && resourceProvider) {
            applyBackgroundImage(bgImage, resourceProvider);
        } else if (bgBrush.style() != Qt::NoBrush) {
            charFormat.setBackground(bgBrush);
            if (id == Html_hr)
                blockFormat.setProperty(QTextFormat::BackgroundBrush, bgBrush);
        }
    }
}